

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_op.h
# Opt level: O2

Nonnull<const_char_*>
absl::lts_20250127::log_internal::MakeCheckOpString<double,double>
          (double v1,double v2,Nonnull<const_char_*> exprtext)

{
  Nonnull<const_char_*> pcVar1;
  CheckOpMessageBuilder comb;
  CheckOpMessageBuilder local_180;
  
  CheckOpMessageBuilder::CheckOpMessageBuilder(&local_180,exprtext);
  std::ostream::_M_insert<double>(v1);
  CheckOpMessageBuilder::ForVar2(&local_180);
  std::ostream::_M_insert<double>(v2);
  pcVar1 = CheckOpMessageBuilder::NewString(&local_180);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_180);
  return pcVar1;
}

Assistant:

absl::Nonnull<const char*> MakeCheckOpString(
    T1 v1, T2 v2, absl::Nonnull<const char*> exprtext) {
  CheckOpMessageBuilder comb(exprtext);
  MakeCheckOpValueString(comb.ForVar1(), v1);
  MakeCheckOpValueString(comb.ForVar2(), v2);
  return comb.NewString();
}